

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLBigDecimal.cpp
# Opt level: O0

XMLCh * xercesc_4_0::XMLBigDecimal::getCanonicalRepresentation(XMLCh *rawData,MemoryManager *memMgr)

{
  int iVar1;
  XMLSize_t XVar2;
  undefined4 extraout_var;
  XMLCh *pXVar3;
  XMLCh *pXStack_80;
  int intLen;
  XMLCh *retPtr;
  XMLCh *retBuffer;
  XMLSize_t strLen;
  NumberFormatException *anon_var_0;
  int local_44;
  int local_40;
  int fractDigits;
  int totalDigits;
  int sign;
  ArrayJanitor<char16_t> janName;
  XMLCh *retBuf;
  MemoryManager *memMgr_local;
  XMLCh *rawData_local;
  undefined4 extraout_var_00;
  
  XVar2 = XMLString::stringLen(rawData);
  iVar1 = (*memMgr->_vptr_MemoryManager[3])(memMgr,XVar2 * 2 + 2);
  janName.fMemoryManager = (MemoryManager *)CONCAT44(extraout_var,iVar1);
  ArrayJanitor<char16_t>::ArrayJanitor
            ((ArrayJanitor<char16_t> *)&totalDigits,(char16_t *)janName.fMemoryManager,memMgr);
  parseDecimal(rawData,(XMLCh *)janName.fMemoryManager,&fractDigits,&local_40,&local_44,memMgr);
  XVar2 = XMLString::stringLen((XMLCh *)janName.fMemoryManager);
  iVar1 = (*memMgr->_vptr_MemoryManager[3])(memMgr,XVar2 * 2 + 8);
  pXVar3 = (XMLCh *)CONCAT44(extraout_var_00,iVar1);
  if ((fractDigits == 0) || (local_40 == 0)) {
    builtin_memcpy(pXVar3,L"0.0",8);
  }
  else {
    pXStack_80 = pXVar3;
    if (fractDigits == -1) {
      pXStack_80 = pXVar3 + 1;
      *pXVar3 = L'-';
    }
    if (local_44 == local_40) {
      *pXStack_80 = L'0';
      pXStack_80[1] = L'.';
      XMLString::copyNString(pXStack_80 + 2,(XMLCh *)janName.fMemoryManager,XVar2);
      (pXStack_80 + 2)[XVar2] = L'\0';
    }
    else if (local_44 == 0) {
      XMLString::copyNString(pXStack_80,(XMLCh *)janName.fMemoryManager,XVar2);
      pXStack_80 = pXStack_80 + XVar2;
      *pXStack_80 = L'.';
      pXStack_80[1] = L'0';
      pXStack_80[2] = L'\0';
    }
    else {
      iVar1 = local_40 - local_44;
      XMLString::copyNString(pXStack_80,(XMLCh *)janName.fMemoryManager,(long)iVar1);
      pXStack_80 = pXStack_80 + iVar1;
      *pXStack_80 = L'.';
      XMLString::copyNString
                (pXStack_80 + 1,
                 (XMLCh *)((long)&(janName.fMemoryManager)->_vptr_MemoryManager + (long)iVar1 * 2),
                 (long)local_44);
      (pXStack_80 + 1)[local_44] = L'\0';
    }
  }
  ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)&totalDigits);
  return pXVar3;
}

Assistant:

XMLCh* XMLBigDecimal::getCanonicalRepresentation(const XMLCh*         const rawData
                                               ,       MemoryManager* const memMgr)
{

    XMLCh* retBuf = (XMLCh*) memMgr->allocate( (XMLString::stringLen(rawData)+1) * sizeof(XMLCh));
    ArrayJanitor<XMLCh> janName(retBuf, memMgr);
    int   sign, totalDigits, fractDigits;

    try
    {
        parseDecimal(rawData, retBuf, sign, totalDigits, fractDigits, memMgr);
    }
    catch (const NumberFormatException&)
    {
        return 0;
    }


    //Extra space reserved in case strLen is zero
    XMLSize_t strLen = XMLString::stringLen(retBuf);
    XMLCh* retBuffer = (XMLCh*) memMgr->allocate( (strLen + 4) * sizeof(XMLCh));

    if ( (sign == 0) || (totalDigits == 0))
    {
        retBuffer[0] = chDigit_0;
        retBuffer[1] = chPeriod;
        retBuffer[2] = chDigit_0;
        retBuffer[3] = chNull;
    }
    else
    {
        XMLCh* retPtr = retBuffer;

        if (sign == -1)
        {
            *retPtr++ = chDash;
        }

        if (fractDigits == totalDigits)   // no integer
        {           
            *retPtr++ = chDigit_0;
            *retPtr++ = chPeriod;
            XMLString::copyNString(retPtr, retBuf, strLen);
            retPtr += strLen;
            *retPtr = chNull;
        }
        else if (fractDigits == 0)        // no fraction
        {
            XMLString::copyNString(retPtr, retBuf, strLen);
            retPtr += strLen;
            *retPtr++ = chPeriod;
            *retPtr++ = chDigit_0;
            *retPtr   = chNull;
        }
        else  // normal
        {
            int intLen = totalDigits - fractDigits;
            XMLString::copyNString(retPtr, retBuf, intLen);
            retPtr += intLen;
            *retPtr++ = chPeriod;
            XMLString::copyNString(retPtr, &(retBuf[intLen]), fractDigits);
            retPtr += fractDigits;
            *retPtr = chNull;
        }

    }
            
    return retBuffer;
}